

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void leaveFullscreenMode(_GLFWwindow *window)

{
  _glfwRestoreVideoMode(window->monitor);
  _glfw.x11.saver.count = _glfw.x11.saver.count + -1;
  if (_glfw.x11.saver.count != 0) {
    return;
  }
  XSetScreenSaver(_glfw.x11.display,_glfw.x11.saver.timeout,_glfw.x11.saver.interval,
                  _glfw.x11.saver.blanking,_glfw.x11.saver.exposure);
  return;
}

Assistant:

static void leaveFullscreenMode(_GLFWwindow* window)
{
    _glfwRestoreVideoMode(window->monitor);

    _glfw.x11.saver.count--;

    if (_glfw.x11.saver.count == 0)
    {
        // Restore old screen saver settings
        XSetScreenSaver(_glfw.x11.display,
                        _glfw.x11.saver.timeout,
                        _glfw.x11.saver.interval,
                        _glfw.x11.saver.blanking,
                        _glfw.x11.saver.exposure);
    }
}